

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datarate_test.cc
# Opt level: O0

void __thiscall
datarate_test::anon_unknown_0::DatarateTestLarge::BasicRateTargetingCBRPeriodicKeyFrameTest
          (DatarateTestLarge *this)

{
  undefined1 uVar1;
  bool bVar2;
  HasNewFatalFailureHelper *this_00;
  __tuple_element_t<4UL,_tuple<const_CodecFactory_*,_TestMode,_int,_unsigned_int,_int>_> *p_Var3;
  Message *message;
  long in_RDI;
  AssertHelper *this_01;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  int bitrate_array [2];
  I420VideoSource video;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffe94;
  double *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  int iVar6;
  Message *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined2 in_stack_fffffffffffffebc;
  undefined1 in_stack_fffffffffffffebe;
  undefined1 in_stack_fffffffffffffebf;
  I420VideoSource *in_stack_fffffffffffffec0;
  allocator *paVar7;
  int in_stack_fffffffffffffed8;
  AssertionResult local_110;
  Message *in_stack_ffffffffffffff08;
  AssertHelper *in_stack_ffffffffffffff10;
  AssertionResult local_e8 [2];
  uint local_c4;
  HasNewFatalFailureHelper local_c0;
  undefined8 local_a8 [3];
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [104];
  
  *(undefined4 *)(in_RDI + 0xd0) = 500;
  *(undefined4 *)(in_RDI + 0xd4) = 500;
  *(undefined4 *)(in_RDI + 0xcc) = 1000;
  *(undefined4 *)(in_RDI + 0x6c) = 1;
  *(undefined4 *)(in_RDI + 0xbc) = 0;
  *(undefined4 *)(in_RDI + 0xc0) = 0x3f;
  *(undefined4 *)(in_RDI + 0x90) = 1;
  *(undefined4 *)(in_RDI + 0x68) = 0;
  *(undefined4 *)(in_RDI + 0xf0) = 0x32;
  paVar7 = &local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"pixel_capture_w320h240.yuv",paVar7);
  uVar5 = 0x136;
  uVar4 = 0;
  libaom_test::I420VideoSource::I420VideoSource
            (in_stack_fffffffffffffec0,
             (string *)
             CONCAT17(in_stack_fffffffffffffebf,
                      CONCAT16(in_stack_fffffffffffffebe,
                               CONCAT24(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8))),
             (uint)((ulong)in_stack_fffffffffffffeb0 >> 0x20),(uint)in_stack_fffffffffffffeb0,
             (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),(int)in_stack_fffffffffffffea8,
             (uint)paVar7,in_stack_fffffffffffffed8);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  local_a8[0] = 0x22600000096;
  this_00 = (HasNewFatalFailureHelper *)
            testing::
            WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
            ::GetParam();
  p_Var3 = std::get<4ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,int,unsigned_int,int>
                     ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
                       *)0x78506c);
  *(undefined4 *)(in_RDI + 0xb8) = *(undefined4 *)((long)local_a8 + (long)*p_Var3 * 4);
  (**(code **)(*(long *)(in_RDI + 0x18) + 0x98))(in_RDI + 0x18);
  uVar1 = testing::internal::AlwaysTrue();
  if ((bool)uVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper(this_00);
    in_stack_fffffffffffffebe = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffebe) {
      (**(code **)(*(long *)(in_RDI + 0x18) + 0x10))(in_RDI + 0x18,local_68);
    }
    bVar2 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure(&local_c0);
    if (bVar2) {
      local_c4 = 2;
    }
    else {
      local_c4 = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)CONCAT44(in_stack_fffffffffffffe94,uVar5));
    if (local_c4 == 0) {
      this_01 = (AssertHelper *)((double)*(uint *)(in_RDI + 0xb8) * 0.85);
      testing::internal::CmpHelperGE<double,double>
                (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                 (double *)CONCAT44(in_stack_fffffffffffffe94,uVar5));
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_e8);
      if (!bVar2) {
        testing::Message::Message((Message *)this_00);
        in_stack_fffffffffffffeb0 =
             testing::Message::operator<<
                       ((Message *)CONCAT44(in_stack_fffffffffffffe94,uVar5),
                        (char (*) [61])CONCAT44(in_stack_fffffffffffffe8c,uVar4));
        in_stack_fffffffffffffea8 =
             testing::AssertionResult::failure_message((AssertionResult *)0x785349);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)this_00,
                   CONCAT13(uVar1,CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)),
                   (char *)in_stack_fffffffffffffeb0,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20)
                   ,in_stack_fffffffffffffea0);
        testing::internal::AssertHelper::operator=(this_01,in_stack_ffffffffffffff08);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe94,uVar5));
        testing::Message::~Message((Message *)0x78539a);
      }
      local_c4 = (uint)!bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x78541e);
      if (local_c4 == 0) {
        testing::internal::CmpHelperLE<double,double>
                  (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                   (double *)CONCAT44(in_stack_fffffffffffffe94,uVar5));
        iVar6 = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
        bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_110);
        if (!bVar2) {
          testing::Message::Message((Message *)this_00);
          message = testing::Message::operator<<
                              ((Message *)CONCAT44(in_stack_fffffffffffffe94,uVar5),
                               (char (*) [63])CONCAT44(in_stack_fffffffffffffe8c,uVar4));
          testing::AssertionResult::failure_message((AssertionResult *)0x7854cf);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)this_00,
                     CONCAT13(uVar1,CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)),
                     (char *)in_stack_fffffffffffffeb0,iVar6,(char *)message);
          testing::internal::AssertHelper::operator=(this_01,in_stack_ffffffffffffff08);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe94,uVar5));
          testing::Message::~Message((Message *)0x78551d);
        }
        local_c4 = (uint)!bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x785598);
        if (local_c4 == 0) {
          local_c4 = 0;
        }
      }
      goto LAB_007855b0;
    }
    if (local_c4 != 2) goto LAB_007855b0;
  }
  iVar6 = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  testing::Message::Message((Message *)this_00);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)this_00,
             CONCAT13(uVar1,CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)),
             (char *)in_stack_fffffffffffffeb0,iVar6,in_stack_fffffffffffffea0);
  testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe94,uVar5));
  testing::Message::~Message((Message *)0x78524d);
  local_c4 = 1;
LAB_007855b0:
  libaom_test::I420VideoSource::~I420VideoSource((I420VideoSource *)0x7855bd);
  return;
}

Assistant:

virtual void BasicRateTargetingCBRPeriodicKeyFrameTest() {
    cfg_.rc_buf_initial_sz = 500;
    cfg_.rc_buf_optimal_sz = 500;
    cfg_.rc_buf_sz = 1000;
    cfg_.rc_dropframe_thresh = 1;
    cfg_.rc_min_quantizer = 0;
    cfg_.rc_max_quantizer = 63;
    cfg_.rc_end_usage = AOM_CBR;
    cfg_.g_lag_in_frames = 0;
    // Periodic keyframe
    cfg_.kf_max_dist = 50;

    ::libaom_test::I420VideoSource video("pixel_capture_w320h240.yuv", 320, 240,
                                         30, 1, 0, 310);
    const int bitrate_array[2] = { 150, 550 };
    cfg_.rc_target_bitrate = bitrate_array[GET_PARAM(4)];
    ResetModel();
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    ASSERT_GE(effective_datarate_, cfg_.rc_target_bitrate * 0.85)
        << " The datarate for the file is lower than target by too much!";
    ASSERT_LE(effective_datarate_, cfg_.rc_target_bitrate * 1.15)
        << " The datarate for the file is greater than target by too much!";
  }